

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_object.cxx
# Opt level: O0

void __thiscall xray_re::xr_object::load_object(xr_object *this,xr_reader *r)

{
  f_r_new<xray_re::xr_surface> read;
  f_r_new<xray_re::xr_surface> read_00;
  f_r_new<xray_re::xr_surface> read_01;
  f_r_new<xray_re::xr_bone> read_02;
  f_r_new<xray_re::xr_bone> read_03;
  f_r_new<xray_re::xr_skl_motion> read_04;
  f_r_new<xray_re::xr_partition> read_05;
  bool bVar1;
  uint32_t uVar2;
  size_t sVar3;
  char *pcVar4;
  reference ppxVar5;
  string *this_00;
  xr_reader *pxVar6;
  offset_in_xr_surface_to_subr in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  f_r_new<xray_re::xr_partition> local_118;
  read_partition_0 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  f_r_new<xray_re::xr_skl_motion> local_f0;
  code *local_e0;
  undefined8 local_d8;
  f_r_new<xray_re::xr_bone> local_d0;
  code *local_c0;
  undefined8 local_b8;
  f_r_new<xray_re::xr_bone> local_b0;
  read_mesh local_a0;
  xr_reader *local_98;
  xr_reader *s;
  xr_surface_vec_it end;
  xr_surface_vec_it it;
  f_r_new<xray_re::xr_surface> local_70;
  code *local_60;
  undefined8 local_58;
  f_r_new<xray_re::xr_surface> local_50;
  code *local_40;
  undefined8 local_38;
  f_r_new<xray_re::xr_surface> local_30;
  unsigned_short local_1a;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_object *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  sVar3 = xr_reader::r_chunk<unsigned_short>(r,0x900,&local_1a);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x7c,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  if (local_1a != 0x10) {
    __assert_fail("version == EOBJ_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x7d,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  sVar3 = xr_reader::r_chunk<unsigned_int>(pxStack_18,0x903,&this->m_flags);
  if (sVar3 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                  ,0x80,"virtual void xray_re::xr_object::load_object(xr_reader &)");
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x912);
  if (sVar3 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_userdata);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x925);
  if (sVar3 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_lod_ref);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x907);
  pxVar6 = pxStack_18;
  if (sVar3 == 0) {
    sVar3 = xr_reader::find_chunk(pxStack_18,0x906);
    pxVar6 = pxStack_18;
    if (sVar3 == 0) {
      sVar3 = xr_reader::find_chunk(pxStack_18,0x905);
      pxVar6 = pxStack_18;
      if (sVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_object.cxx"
                      ,0x9d,"virtual void xray_re::xr_object::load_object(xr_reader &)");
      }
      uVar2 = xr_reader::r_u32(pxStack_18);
      xr_reader::f_r_new<xray_re::xr_surface>::f_r_new(&local_70,0x22d720);
      read_01._8_8_ = in_stack_fffffffffffffe00;
      read_01.pmf = in_stack_fffffffffffffdf8;
      xr_reader::
      r_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_reader::f_r_new<xray_re::xr_surface>>
                (pxVar6,(ulong)uVar2,&this->m_surfaces,read_01);
      xr_reader::debug_find_chunk(pxStack_18);
      sVar3 = xr_reader::find_chunk(pxStack_18,0x918);
      if (sVar3 != 0) {
        end._M_current =
             (xr_surface **)
             std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::begin
                       (&this->m_surfaces);
        s = (xr_reader *)
            std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>::end
                      (&this->m_surfaces);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&end,(__normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                                        *)&s), bVar1) {
          pcVar4 = xr_reader::skip_sz(pxStack_18);
          ppxVar5 = __gnu_cxx::
                    __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
                    ::operator*(&end);
          this_00 = xr_surface::cshader_abi_cxx11_(*ppxVar5);
          std::__cxx11::string::operator=((string *)this_00,pcVar4);
          __gnu_cxx::
          __normal_iterator<xray_re::xr_surface_**,_std::vector<xray_re::xr_surface_*,_std::allocator<xray_re::xr_surface_*>_>_>
          ::operator++(&end);
        }
        xr_reader::debug_find_chunk(pxStack_18);
      }
    }
    else {
      uVar2 = xr_reader::r_u32(pxStack_18);
      local_60 = xr_surface::load_1;
      local_58 = 0;
      xr_reader::f_r_new<xray_re::xr_surface>::f_r_new(&local_50,0x22d630);
      read_00._8_8_ = in_stack_fffffffffffffe00;
      read_00.pmf = in_stack_fffffffffffffdf8;
      xr_reader::
      r_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_reader::f_r_new<xray_re::xr_surface>>
                (pxVar6,(ulong)uVar2,&this->m_surfaces,read_00);
      xr_reader::debug_find_chunk(pxStack_18);
    }
  }
  else {
    uVar2 = xr_reader::r_u32(pxStack_18);
    local_40 = xr_surface::load_2;
    local_38 = 0;
    xr_reader::f_r_new<xray_re::xr_surface>::f_r_new(&local_30,0x22d540);
    read._8_8_ = in_stack_fffffffffffffe00;
    read.pmf = in_stack_fffffffffffffdf8;
    xr_reader::
    r_seq<std::vector<xray_re::xr_surface*,std::allocator<xray_re::xr_surface*>>,xray_re::xr_reader::f_r_new<xray_re::xr_surface>>
              (pxVar6,(ulong)uVar2,&this->m_surfaces,read);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  pxVar6 = xr_reader::open_chunk(pxStack_18,0x910);
  local_98 = pxVar6;
  if (pxVar6 != (xr_reader *)0x0) {
    read_mesh::read_mesh(&local_a0,this);
    xr_reader::r_chunks<std::vector<xray_re::xr_mesh*,std::allocator<xray_re::xr_mesh*>>,read_mesh>
              (pxVar6,&this->m_meshes,local_a0);
    xr_reader::close_chunk(pxStack_18,&local_98);
  }
  pxVar6 = xr_reader::open_chunk(pxStack_18,0x921);
  local_98 = pxVar6;
  if (pxVar6 == (xr_reader *)0x0) {
    sVar3 = xr_reader::find_chunk(pxStack_18,0x913);
    pxVar6 = local_98;
    if (sVar3 != 0) {
      uVar2 = xr_reader::r_u32(pxStack_18);
      local_e0 = xr_bone::load_0;
      local_d8 = 0;
      xr_reader::f_r_new<xray_re::xr_bone>::f_r_new(&local_d0,0x235940);
      read_03._8_8_ = in_stack_fffffffffffffe00;
      read_03.pmf = in_stack_fffffffffffffdf8;
      xr_reader::
      r_seq<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
                (pxVar6,(ulong)uVar2,&this->m_bones,read_03);
      xr_reader::debug_find_chunk(pxStack_18);
    }
  }
  else {
    local_c0 = xr_bone::load_1;
    local_b8 = 0;
    xr_reader::f_r_new<xray_re::xr_bone>::f_r_new(&local_b0,0x2354e0);
    read_02._8_8_ = in_stack_fffffffffffffe00;
    read_02.pmf = in_stack_fffffffffffffdf8;
    xr_reader::
    r_chunks<std::vector<xray_re::xr_bone*,std::allocator<xray_re::xr_bone*>>,xray_re::xr_reader::f_r_new<xray_re::xr_bone>>
              (pxVar6,&this->m_bones,read_02);
    xr_reader::close_chunk(pxStack_18,&local_98);
  }
  setup_bones(this);
  sVar3 = xr_reader::find_chunk(pxStack_18,0x916);
  pxVar6 = pxStack_18;
  if (sVar3 != 0) {
    uVar2 = xr_reader::r_u32(pxStack_18);
    local_f8 = 0;
    local_100 = 0x11;
    xr_reader::f_r_new<xray_re::xr_skl_motion>::f_r_new(&local_f0,0x11);
    read_04._8_8_ = in_stack_fffffffffffffe00;
    read_04.pmf = in_stack_fffffffffffffdf8;
    xr_reader::
    r_seq<std::vector<xray_re::xr_skl_motion*,std::allocator<xray_re::xr_skl_motion*>>,xray_re::xr_reader::f_r_new<xray_re::xr_skl_motion>>
              (pxVar6,(ulong)uVar2,&this->m_motions,read_04);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x924);
  if (sVar3 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_motion_refs);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x919);
  pxVar6 = pxStack_18;
  if (sVar3 == 0) {
    sVar3 = xr_reader::find_chunk(pxStack_18,0x923);
    if (sVar3 != 0) {
      pxVar6 = pxStack_18;
      uVar2 = xr_reader::r_u32(pxStack_18);
      xr_reader::f_r_new<xray_re::xr_partition>::f_r_new(&local_118,0x236330);
      read_05._8_8_ = pxVar6;
      read_05.pmf = in_stack_fffffffffffffdf8;
      xr_reader::
      r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,xray_re::xr_reader::f_r_new<xray_re::xr_partition>>
                (pxVar6,(ulong)uVar2,&this->m_partitions,read_05);
      xr_reader::debug_find_chunk(pxStack_18);
    }
  }
  else {
    uVar2 = xr_reader::r_u32(pxStack_18);
    read_partition_0::read_partition_0(&local_108,&this->m_bones);
    xr_reader::
    r_seq<std::vector<xray_re::xr_partition*,std::allocator<xray_re::xr_partition*>>,read_partition_0>
              (pxVar6,(ulong)uVar2,&this->m_partitions,local_108);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x920);
  if (sVar3 != 0) {
    xr_reader::r_fvector3(pxStack_18,&this->m_position);
    xr_reader::r_fvector3(pxStack_18,&this->m_rotation);
    xr_reader::debug_find_chunk(pxStack_18);
  }
  sVar3 = xr_reader::find_chunk(pxStack_18,0x922);
  if (sVar3 != 0) {
    xr_reader::r_sz(pxStack_18,&this->m_owner_name);
    uVar2 = xr_reader::r_u32(pxStack_18);
    this->m_creation_time = uVar2;
    xr_reader::r_sz(pxStack_18,&this->m_modif_name);
    uVar2 = xr_reader::r_u32(pxStack_18);
    this->m_modified_time = uVar2;
    xr_reader::debug_find_chunk(pxStack_18);
  }
  return;
}

Assistant:

void xr_object::load_object(xr_reader& r)
{
	uint16_t version;
	if (!r.r_chunk<uint16_t>(EOBJ_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == EOBJ_VERSION);

	if (!r.r_chunk<uint32_t>(EOBJ_CHUNK_FLAGS, m_flags))
		xr_not_expected();

	if (r.find_chunk(EOBJ_CHUNK_USERDATA)) {
		r.r_sz(m_userdata);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_LOD_REF)) {
		r.r_sz(m_lod_ref);
		r.debug_find_chunk();
	}

	if (r.find_chunk(EOBJ_CHUNK_SURFACES_2)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_2));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_1)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_1));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_SURFACES_0)) {
		r.r_seq(r.r_u32(), m_surfaces, xr_reader::f_r_new<xr_surface>(&xr_surface::load_0));
		r.debug_find_chunk();
		if (r.find_chunk(EOBJ_CHUNK_SHADERS_0)) {
			for (xr_surface_vec_it it = m_surfaces.begin(), end = m_surfaces.end();
					it != end; ++it) {
				(*it)->cshader() = r.skip_sz();
			}
			r.debug_find_chunk();
		}
	} else {
		xr_not_expected();
	}

	xr_reader* s = r.open_chunk(EOBJ_CHUNK_MESHES);
	if (s) {
		s->r_chunks(m_meshes, read_mesh(*this));
		r.close_chunk(s);
	}

	s = r.open_chunk(EOBJ_CHUNK_BONES_1);
	if (s) {
		s->r_chunks(m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_1));
		r.close_chunk(s);
	} else if (r.find_chunk(EOBJ_CHUNK_BONES_0)) {
		s->r_seq(r.r_u32(), m_bones, xr_reader::f_r_new<xr_bone>(&xr_bone::load_0));
		r.debug_find_chunk();
	}
	setup_bones();
	if (r.find_chunk(EOBJ_CHUNK_MOTIONS)) {
		r.r_seq(r.r_u32(), m_motions, xr_reader::f_r_new<xr_skl_motion>(&xr_skl_motion::load));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_MOTION_REFS)) {
		r.r_sz(m_motion_refs);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_0)) {
		r.r_seq(r.r_u32(), m_partitions, read_partition_0(m_bones));
		r.debug_find_chunk();
	} else if (r.find_chunk(EOBJ_CHUNK_PARTITIONS_1)) {
		r.r_seq(r.r_u32(), m_partitions, xr_reader::f_r_new<xr_partition>(&xr_partition::load_1));
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_TRANSFORM)) {
		r.r_fvector3(m_position);
		r.r_fvector3(m_rotation);
		r.debug_find_chunk();
	}
	if (r.find_chunk(EOBJ_CHUNK_REVISION)) {
		r.r_sz(m_owner_name);
		m_creation_time = r.r_u32();
		r.r_sz(m_modif_name);
		m_modified_time = r.r_u32();
		r.debug_find_chunk();
	}
}